

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O1

void DumpGraph(RegVmLoweredModule *lowModule)

{
  InstructionRegVmLowerGraphContext instLowerGraphCtx;
  OutputContext outputCtx;
  char tempBuf [4096];
  char outputBuf [4096];
  InstructionRegVmLowerGraphContext local_2290;
  OutputContext local_2268;
  char local_2028 [4096];
  char local_1028 [4096];
  
  local_2268.stream = (void *)0x0;
  local_2268.openStream = OutputContext::FileOpen;
  local_2268.writeStream = OutputContext::FileWrite;
  local_2268.closeStream = OutputContext::FileClose;
  local_2268.outputBufSize = 0x1000;
  local_2268.outputBufPos = 0;
  local_2268.outputBuf = local_1028;
  local_2268.tempBuf = local_2028;
  local_2268.tempBufSize = 0x1000;
  local_2268.stream = fopen("inst_graph_reg_low.txt","w");
  local_2268.writeStream = OutputContext::FileWrite;
  local_2290.code = (char *)0x0;
  local_2290.lastStart = (char *)0x0;
  local_2290.lastStartOffset = 0;
  local_2290.lastEndOffset = 0;
  local_2290.showSource = true;
  local_2290.showAnnotatedSource = false;
  local_2290.output = &local_2268;
  PrintGraph(&local_2290,lowModule);
  fclose((FILE *)local_2268.stream);
  local_2268.stream = (void *)0x0;
  OutputContext::~OutputContext(&local_2268);
  return;
}

Assistant:

void DumpGraph(RegVmLoweredModule *lowModule)
{
	OutputContext outputCtx;

	char outputBuf[4096];
	outputCtx.outputBuf = outputBuf;
	outputCtx.outputBufSize = 4096;

	char tempBuf[4096];
	outputCtx.tempBuf = tempBuf;
	outputCtx.tempBufSize = 4096;

	outputCtx.stream = OutputContext::FileOpen("inst_graph_reg_low.txt");
	outputCtx.writeStream = OutputContext::FileWrite;

	InstructionRegVmLowerGraphContext instLowerGraphCtx(outputCtx);

	instLowerGraphCtx.showSource = true;

	PrintGraph(instLowerGraphCtx, lowModule);

	OutputContext::FileClose(outputCtx.stream);
	outputCtx.stream = NULL;
}